

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O3

void decode_fglrx_ioctl_4f(fglrx_ioctl_4f *d,mmt_memory_dump *args,int argc)

{
  mmt_buf *buf;
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  bVar1 = true;
  if (fglrx_show_unk_zero_fields != 0 || d->unk00 != 0) {
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx);
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk04 != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk04: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk08 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk08: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk0c != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk10 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk10: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk14 != 0) || (bVar2 = true, !bVar1)) {
    fprintf(_stdout,"%sunk14: 0x%08x",", ");
    bVar2 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk18 != 0) || (bVar1 = true, !bVar2)) {
    fprintf(_stdout,"%sunk18: 0x%08x",", ");
    bVar1 = fglrx_show_unk_zero_fields == 0;
  }
  fglrx_pfx = ", ";
  if ((d->unk1c != 0) || (!bVar1)) {
    fprintf(_stdout,"%sunk1c: 0x%08x",", ");
  }
  fglrx_pfx = ", ";
  if (d->ptr1 == 0) {
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024b608;
    }
    fputs(" [no data]",_stdout);
    buf = (mmt_buf *)0x0;
  }
LAB_0024b608:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_4f(struct fglrx_ioctl_4f *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	fglrx_print_x32(d, unk14);
	fglrx_print_x32(d, unk18);
	fglrx_print_x32(d, unk1c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}